

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void kj::(anonymous_namespace)::expectRes<kj::String,char,13ul>
               (EncodingResult<kj::String> *result,char (*expected) [13],bool errors)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  undefined7 in_register_00000011;
  char *ptrCopy;
  bool in_R8B;
  ArrayPtr<const_char> expected_00;
  char *local_38;
  size_t local_30;
  ArrayDisposer *local_28;
  undefined1 local_20;
  
  expected_00.size_ = CONCAT71(in_register_00000011,errors) & 0xffffffff;
  pcVar1 = (result->super_String).content.ptr;
  sVar2 = (result->super_String).content.size_;
  pAVar3 = (result->super_String).content.disposer;
  (result->super_String).content.ptr = (char *)0x0;
  (result->super_String).content.size_ = 0;
  local_20 = result->hadErrors;
  expected_00.ptr = &DAT_0000000c;
  local_38 = pcVar1;
  local_30 = sVar2;
  local_28 = pAVar3;
  expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&local_38,(EncodingResult<kj::String> *)expected,expected_00,
             in_R8B);
  if (pcVar1 != (char *)0x0) {
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}